

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_image_color_brightness_to_buffer
          (rf_image *__return_storage_ptr__,rf_image image,int brightness,void *dst,rf_int dst_size)

{
  rf_image image_00;
  rf_image rVar1;
  int iVar2;
  rf_color rVar3;
  int iVar4;
  int local_60;
  int local_5c;
  int c_b;
  int c_g;
  int c_r;
  rf_color pixel_rgba32;
  void *dst_pixel;
  void *src_pixel;
  long lStack_38;
  int index;
  rf_int x;
  rf_int y;
  int bpp;
  rf_int dst_size_local;
  void *dst_local;
  int brightness_local;
  
  rVar1 = image;
  memset(__return_storage_ptr__,0,0x18);
  if (((undefined1  [24])image & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
    image_00._16_8_ = dst_size;
    image_00._0_16_ = image._8_16_;
    iVar2 = rf_image_size(image_00);
    if (iVar2 <= dst_size) {
      dst_local._4_4_ = brightness;
      if (brightness < -0xff) {
        dst_local._4_4_ = -0xff;
      }
      if (0xff < dst_local._4_4_) {
        dst_local._4_4_ = 0xff;
      }
      iVar2 = rf_bytes_per_pixel(image.format);
      x = 0;
      while( true ) {
        if (image.height <= x) break;
        for (lStack_38 = 0; lStack_38 < image.width; lStack_38 = lStack_38 + 1) {
          iVar4 = (int)x * image.width + (int)lStack_38;
          _c_r = (void *)((long)dst + (long)(iVar4 * iVar2));
          rVar3 = rf_format_one_pixel_to_rgba32
                            ((void *)((long)image.data + (long)(iVar4 * iVar2)),image.format);
          c_b = ((uint)rVar3 & 0xff) + dst_local._4_4_;
          local_5c = ((uint)rVar3 >> 8 & 0xff) + dst_local._4_4_;
          local_60 = ((uint)rVar3 >> 0x10 & 0xff) + dst_local._4_4_;
          if (c_b < 0) {
            c_b = 1;
          }
          if (0xff < c_b) {
            c_b = 0xff;
          }
          if (local_5c < 0) {
            local_5c = 1;
          }
          if (0xff < local_5c) {
            local_5c = 0xff;
          }
          if (local_60 < 0) {
            local_60 = 1;
          }
          if (0xff < local_60) {
            local_60 = 0xff;
          }
          c_g._3_1_ = rVar3.a;
          c_g._0_3_ = CONCAT12((char)local_60,CONCAT11((char)local_5c,(char)c_b));
          rf_format_one_pixel(&c_g,RF_UNCOMPRESSED_R8G8B8A8,_c_r,image.format);
        }
        x = x + 1;
      }
      __return_storage_ptr__->data = image.data;
      __return_storage_ptr__->width = image.width;
      __return_storage_ptr__->height = image.height;
      image._16_8_ = rVar1._16_8_;
      __return_storage_ptr__->format = image.format;
      __return_storage_ptr__->valid = image.valid;
      *(undefined3 *)&__return_storage_ptr__->field_0x15 = image._21_3_;
      __return_storage_ptr__->data = dst;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_color_brightness_to_buffer(rf_image image, int brightness, void* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (image.valid)
    {
        if (dst_size >= rf_image_size(image))
        {
            if (brightness < -255) brightness = -255;
            if (brightness > +255) brightness = +255;

            int bpp = rf_bytes_per_pixel(image.format);

            for (rf_int y = 0; y < image.height; y++)
            {
                for (rf_int x = 0; x < image.width; x++)
                {
                    int index = y * image.width + x;

                    void* src_pixel = ((unsigned char*)image.data) + index * bpp;
                    void* dst_pixel = ((unsigned char*)dst) + index * bpp;

                    rf_color pixel_rgba32 = rf_format_one_pixel_to_rgba32(src_pixel, image.format);

                    int c_r = pixel_rgba32.r + brightness;
                    int c_g = pixel_rgba32.g + brightness;
                    int c_b = pixel_rgba32.b + brightness;

                    if (c_r < 0) c_r = 1;
                    if (c_r > 255) c_r = 255;

                    if (c_g < 0) c_g = 1;
                    if (c_g > 255) c_g = 255;

                    if (c_b < 0) c_b = 1;
                    if (c_b > 255) c_b = 255;

                    pixel_rgba32.r = (unsigned char) c_r;
                    pixel_rgba32.g = (unsigned char) c_g;
                    pixel_rgba32.b = (unsigned char) c_b;

                    rf_format_one_pixel(&pixel_rgba32, RF_UNCOMPRESSED_R8G8B8A8, dst_pixel, image.format);
                }
            }

            result = image;
            result.data = dst;
        }
    }

    return result;
}